

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::minimumSize(QMainWindowLayout *this)

{
  minimumSize(this + -0x10);
  return;
}

Assistant:

QSize QMainWindowLayout::minimumSize() const
{
    if (!minSize.isValid()) {
        minSize = layoutState.minimumSize();
        const QSize sbMin = statusbar ? statusbar->minimumSize() : QSize(0, 0);
        minSize = QSize(qMax(sbMin.width(), minSize.width()),
                        sbMin.height() + minSize.height());
    }
    return minSize;
}